

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O2

void canvas_resortinlets(_glist *x)

{
  t_gobj *ptVar1;
  t_pd *x_00;
  int iVar2;
  long *plVar3;
  _inlet *i;
  t_gobj **pptVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  t_gobj **pptVar8;
  long *plVar9;
  bool bVar10;
  int x1;
  int y2;
  int x2;
  int y1;
  int local_54;
  long *local_50;
  size_t local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  uVar6 = 0;
  pptVar8 = &x->gl_list;
  pptVar4 = pptVar8;
  while (ptVar1 = *pptVar4, ptVar1 != (t_gobj *)0x0) {
    uVar6 = uVar6 + (ptVar1->g_pd == vinlet_class);
    pptVar4 = &ptVar1->g_next;
  }
  if (1 < uVar6) {
    local_48 = (ulong)uVar6 << 3;
    local_50 = (long *)getbytes(local_48);
    plVar3 = local_50;
    while (ptVar1 = *pptVar8, ptVar1 != (t_gobj *)0x0) {
      if (ptVar1->g_pd == vinlet_class) {
        *plVar3 = (long)ptVar1;
        plVar3 = plVar3 + 1;
      }
      pptVar8 = &ptVar1->g_next;
    }
    uVar5 = uVar6;
    while (bVar10 = uVar5 != 0, uVar5 = uVar5 - 1, bVar10) {
      iVar2 = -0x7fffffff;
      plVar9 = (long *)0x0;
      plVar3 = local_50;
      uVar7 = uVar6;
      while (bVar10 = uVar7 != 0, uVar7 = uVar7 - 1, bVar10) {
        if (((t_gobj *)*plVar3 != (t_gobj *)0x0) &&
           (gobj_getrect((t_gobj *)*plVar3,x,&local_54,&local_34,&local_38,&local_3c),
           iVar2 < local_54)) {
          plVar9 = plVar3;
          iVar2 = local_54;
        }
        plVar3 = plVar3 + 1;
      }
      if (plVar9 == (long *)0x0) break;
      x_00 = (t_pd *)*plVar9;
      *plVar9 = 0;
      i = vinlet_getit(x_00);
      obj_moveinletfirst(&x->gl_obj,i);
    }
    freebytes(local_50,local_48);
    if (((x->gl_owner != (_glist *)0x0) && ((x->field_0xe9 & 8) == 0)) &&
       (iVar2 = glist_isvisible(x->gl_owner), iVar2 != 0)) {
      canvas_fixlinesfor(x->gl_owner,&x->gl_obj);
    }
  }
  return;
}

Assistant:

void canvas_resortinlets(t_canvas *x)
{
    int ninlets = 0, i, j, xmax;
    t_gobj *y, **vec, **vp, **maxp;

    for (ninlets = 0, y = x->gl_list; y; y = y->g_next)
        if (pd_class(&y->g_pd) == vinlet_class) ninlets++;

    if (ninlets < 2) return;

    vec = (t_gobj **)getbytes(ninlets * sizeof(*vec));

    for (y = x->gl_list, vp = vec; y; y = y->g_next)
        if (pd_class(&y->g_pd) == vinlet_class) *vp++ = y;

    for (i = ninlets; i--;)
    {
        t_inlet *ip;
        for (vp = vec, xmax = -0x7fffffff, maxp = 0, j = ninlets;
            j--; vp++)
        {
            int x1, y1, x2, y2;
            t_gobj *g = *vp;
            if (!g) continue;
            gobj_getrect(g, x, &x1, &y1, &x2, &y2);
            if (x1 > xmax) xmax = x1, maxp = vp;
        }
        if (!maxp) break;
        y = *maxp;
        *maxp = 0;
        ip = vinlet_getit(&y->g_pd);

        obj_moveinletfirst(&x->gl_obj, ip);
    }
    freebytes(vec, ninlets * sizeof(*vec));
    if (x->gl_owner && !x->gl_isclone && glist_isvisible(x->gl_owner))
        canvas_fixlinesfor(x->gl_owner, &x->gl_obj);
}